

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O2

bool __thiscall
DIS::RecordSpecification::operator==(RecordSpecification *this,RecordSpecification *rhs)

{
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  size_t idx;
  ulong uVar4;
  long lVar5;
  
  bVar3 = true;
  lVar5 = 0;
  for (uVar4 = 0;
      pRVar1 = (this->_recordSets).
               super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->_recordSets).
                             super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x18);
      uVar4 = uVar4 + 1) {
    bVar2 = RecordSpecificationElement::operator==
                      ((RecordSpecificationElement *)
                       ((long)&pRVar1->_vptr_RecordSpecificationElement + lVar5),
                       (RecordSpecificationElement *)
                       ((long)&((rhs->_recordSets).
                                super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_RecordSpecificationElement + lVar5));
    bVar3 = (bool)(bVar3 & bVar2);
    lVar5 = lVar5 + 0x18;
  }
  return bVar3;
}

Assistant:

bool RecordSpecification::operator ==(const RecordSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _recordSets.size(); idx++)
     {
        if( ! ( _recordSets[idx] == rhs._recordSets[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }